

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void * lua_newuserdatauv(lua_State *L,size_t size,int nuvalue)

{
  StkId pSVar1;
  Udata *pUVar2;
  long lVar3;
  Udata *x_;
  
  pUVar2 = luaS_newudata(L,size,nuvalue);
  pSVar1 = (L->top).p;
  *(Udata **)pSVar1 = pUVar2;
  (pSVar1->val).tt_ = 'G';
  (L->top).p = (StkId)((L->top).offset + 0x10);
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  lVar3 = 0x20;
  if (pUVar2->nuvalue != 0) {
    lVar3 = (ulong)pUVar2->nuvalue * 0x10 + 0x28;
  }
  return (void *)((long)pUVar2->uv + lVar3 + -0x28);
}

Assistant:

LUA_API void *lua_newuserdatauv (lua_State *L, size_t size, int nuvalue) {
  Udata *u;
  lua_lock(L);
  api_check(L, 0 <= nuvalue && nuvalue < USHRT_MAX, "invalid value");
  u = luaS_newudata(L, size, nuvalue);
  setuvalue(L, s2v(L->top.p), u);
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
  return getudatamem(u);
}